

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Tree::has_child(Tree *this,size_t node,size_t ch)

{
  NodeData *pNVar1;
  
  pNVar1 = _p(this,ch);
  return pNVar1->m_parent == node;
}

Assistant:

bool has_child(size_t node, size_t ch) const { return _p(ch)->m_parent == node; }